

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1ba5289::DescriptorImpl::ToNormalizedString
          (DescriptorImpl *this,SigningProvider *arg,string *out,DescriptorCache *cache)

{
  byte bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  bool ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = (**(code **)((in_RDI->_M_dataplus)._M_p + 0x98))(in_RDI,in_RSI,in_RDX,2,in_RCX);
  this_00 = &local_28;
  AddChecksum(in_RDI);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ToNormalizedString(const SigningProvider& arg, std::string& out, const DescriptorCache* cache) const override final
    {
        bool ret = ToStringHelper(&arg, out, StringType::NORMALIZED, cache);
        out = AddChecksum(out);
        return ret;
    }